

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLContextFactory.cpp
# Opt level: O0

PixmapSurfacePair
eglu::anon_unknown_1::createPixmap
          (NativeDisplay *nativeDisplay,NativePixmapFactory *pixmapFactory,EGLDisplay eglDisplay,
          EGLConfig eglConfig,RenderConfig *config)

{
  int local_74;
  int local_70;
  EGLAttrib local_60;
  EGLAttrib attribList [1];
  EGLSurface surface;
  NativePixmap *nativePixmap;
  int height;
  int width;
  RenderConfig *config_local;
  EGLConfig eglConfig_local;
  EGLDisplay eglDisplay_local;
  NativePixmapFactory *pixmapFactory_local;
  NativeDisplay *nativeDisplay_local;
  
  if (config->width == -1) {
    local_70 = 0x200;
  }
  else {
    local_70 = config->width;
  }
  nativePixmap._4_4_ = local_70;
  if (config->height == -1) {
    local_74 = 0x200;
  }
  else {
    local_74 = config->height;
  }
  nativePixmap._0_4_ = local_74;
  surface = (EGLSurface)0x0;
  attribList[0] = 0;
  local_60 = 0x3038;
  _height = config;
  config_local = (RenderConfig *)eglConfig;
  eglConfig_local = eglDisplay;
  eglDisplay_local = pixmapFactory;
  pixmapFactory_local = (NativePixmapFactory *)nativeDisplay;
  surface = (EGLSurface)
            (**(code **)(*(long *)pixmapFactory + 0x20))
                      (pixmapFactory,nativeDisplay,eglDisplay,eglConfig,&local_60,local_70,local_74)
  ;
  attribList[0] =
       (EGLAttrib)
       createPixmapSurface((NativeDisplay *)pixmapFactory_local,(NativePixmap *)surface,
                           eglConfig_local,config_local,&local_60);
  std::pair<eglu::NativePixmap_*,_void_*>::pair<eglu::NativePixmap_*&,_void_*&,_true>
            ((pair<eglu::NativePixmap_*,_void_*> *)&nativeDisplay_local,(NativePixmap **)&surface,
             (void **)attribList);
  return _nativeDisplay_local;
}

Assistant:

PixmapSurfacePair createPixmap (NativeDisplay* nativeDisplay, const NativePixmapFactory* pixmapFactory, EGLDisplay eglDisplay, EGLConfig eglConfig, const glu::RenderConfig& config)
{
	const int			width			= (config.width		== glu::RenderConfig::DONT_CARE ? DEFAULT_OFFSCREEN_WIDTH	: config.width);
	const int			height			= (config.height	== glu::RenderConfig::DONT_CARE ? DEFAULT_OFFSCREEN_HEIGHT	: config.height);
	NativePixmap*		nativePixmap	= DE_NULL;
	EGLSurface			surface			= EGL_NO_SURFACE;
	const EGLAttrib		attribList[]	= { EGL_NONE };

	nativePixmap = pixmapFactory->createPixmap(nativeDisplay, eglDisplay, eglConfig, &attribList[0], width, height);

	try
	{
		surface = eglu::createPixmapSurface(*nativeDisplay, *nativePixmap, eglDisplay, eglConfig, attribList);
	}
	catch (...)
	{
		delete nativePixmap;
		throw;
	}

	return PixmapSurfacePair(nativePixmap, surface);
}